

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dothrow.c
# Opt level: O2

int hero_breaks(obj *obj,xchar x,xchar y,boolean from_invent)

{
  boolean bVar1;
  bool in_view;
  
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
      in_view = true;
      if (((youmonst.data)->mflags1 & 0x1000) == 0) goto LAB_0017c26c;
      goto LAB_0017c237;
    }
  }
  else {
LAB_0017c237:
    if (ublindf == (obj *)0x0) {
      in_view = false;
      goto LAB_0017c26c;
    }
  }
  in_view = ublindf->oartifact == '\x1d';
LAB_0017c26c:
  bVar1 = breaktest(obj);
  if (bVar1 != '\0') {
    breakmsg(obj,in_view);
    breakobj(obj,x,y,'\x01',from_invent);
  }
  return (uint)(bVar1 != '\0');
}

Assistant:

int hero_breaks(struct obj *obj,
		xchar x, xchar y, /* object location (ox, oy may not be right) */
		boolean from_invent) /* thrown or dropped by player; maybe on shop bill */
{
	boolean in_view = !Blind;
	if (!breaktest(obj)) return 0;
	breakmsg(obj, in_view);
	breakobj(obj, x, y, TRUE, from_invent);
	return 1;
}